

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,REF_INT *nodes,REF_INT new_node)

{
  REF_INT id;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  uint uVar2;
  uint uVar3;
  REF_INT sense;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_DBL uv [2];
  REF_INT local_84;
  REF_NODE local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  id = nodes[3];
  uVar2 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,&local_58,&local_84);
  if (uVar2 == 0) {
    local_80 = pRVar1;
    uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,&local_68,&local_84);
    if (uVar2 == 0) {
      uVar2 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&local_78,&local_84);
      pRVar1 = local_80;
      if (uVar2 == 0) {
        local_48 = (local_58 + local_68 + local_78) / 3.0;
        local_40 = (local_50 + local_60 + local_70) / 3.0;
        uVar2 = ref_geom_add(ref_geom,new_node,2,id,&local_48);
        if (uVar2 == 0) {
          uVar3 = ref_egads_eval_at(ref_geom,2,id,&local_48,pRVar1->real + new_node * 0xf,
                                    (REF_DBL *)0x0);
          uVar2 = 0;
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x3d5,"ref_geom_add_constrain_inside_midnode",(ulong)uVar3,"eval");
            uVar2 = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x3d1,"ref_geom_add_constrain_inside_midnode",(ulong)uVar2);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x3cd,"ref_geom_add_constrain_inside_midnode",(ulong)uVar2);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3cb,
             "ref_geom_add_constrain_inside_midnode",(ulong)uVar2,"cell uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x3c9,
           "ref_geom_add_constrain_inside_midnode",(ulong)uVar2,"cell uv0");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_inside_midnode(REF_GRID ref_grid,
                                                         REF_INT *nodes,
                                                         REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT type, id;
  REF_DBL uv[2], uv0[2], uv1[2], uv2[2];
  REF_INT sense;

  type = REF_GEOM_FACE;
  id = nodes[3];

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, type, uv0, &sense),
      "cell uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, type, uv1, &sense),
      "cell uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, type, uv2, &sense),
      "cell uv2");

  uv[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  uv[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;
  RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");

  RSS(ref_egads_eval_at(ref_geom, type, id, uv,
                        ref_node_xyz_ptr(ref_node, new_node), NULL),
      "eval");

  return REF_SUCCESS;
}